

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatchTest.h
# Opt level: O0

void __thiscall
oout::MatchTest::MatchTest<oout::RegexMatch>
          (MatchTest *this,shared_ptr<const_oout::Text> *text,shared_ptr<const_oout::Match> *match1,
          shared_ptr<const_oout::Match> *match2,shared_ptr<oout::RegexMatch> *matchn)

{
  shared_ptr<const_oout::Match> local_50;
  shared_ptr<const_oout::Match> local_40;
  shared_ptr<oout::RegexMatch> *local_30;
  shared_ptr<oout::RegexMatch> *matchn_local;
  shared_ptr<const_oout::Match> *match2_local;
  shared_ptr<const_oout::Match> *match1_local;
  shared_ptr<const_oout::Text> *text_local;
  MatchTest *this_local;
  
  local_30 = matchn;
  matchn_local = (shared_ptr<oout::RegexMatch> *)match2;
  match2_local = match1;
  match1_local = (shared_ptr<const_oout::Match> *)text;
  text_local = (shared_ptr<const_oout::Text> *)this;
  std::
  make_shared<oout::AllMatch,std::shared_ptr<oout::Match_const>const&,std::shared_ptr<oout::Match_const>const&,std::shared_ptr<oout::RegexMatch>const&>
            (&local_50,match1,(shared_ptr<oout::RegexMatch> *)match2);
  std::shared_ptr<oout::Match_const>::shared_ptr<oout::AllMatch,void>
            ((shared_ptr<oout::Match_const> *)&local_40,(shared_ptr<oout::AllMatch> *)&local_50);
  MatchTest(this,text,&local_40);
  std::shared_ptr<const_oout::Match>::~shared_ptr(&local_40);
  std::shared_ptr<oout::AllMatch>::~shared_ptr((shared_ptr<oout::AllMatch> *)&local_50);
  return;
}

Assistant:

MatchTest(
		const std::shared_ptr<const Text> &text,
		const std::shared_ptr<const Match> &match1,
		const std::shared_ptr<const Match> &match2,
		const std::shared_ptr<T> & ... matchn
	) : MatchTest(text, std::make_shared<AllMatch>(match1, match2, matchn...))
	{
	}